

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O2

_Bool Curl_cert_hostcheck(char *match,size_t matchlen,char *hostname,size_t hostlen)

{
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  char *__n;
  char *__n_00;
  
  if (((match != (char *)0x0) && (hostname != (char *)0x0 && *match != '\0')) && (*hostname != '\0')
     ) {
    __n_00 = (char *)(hostlen - (hostname[hostlen - 1] == '.'));
    __n = (char *)(matchlen - (match[matchlen - 1] == '.'));
    if ((*match == '*') && (match[1] == '.')) {
      _Var1 = Curl_host_is_ipnum(hostname);
      if (_Var1) {
        return false;
      }
      pcVar2 = (char *)memchr(match,0x2e,(size_t)__n);
      if ((pcVar2 != (char *)0x0) &&
         (pcVar3 = (char *)Curl_memrchr(match,0x2e,(size_t)__n), pcVar3 != pcVar2)) {
        pcVar3 = (char *)memchr(hostname,0x2e,(size_t)__n_00);
        if (pcVar3 == (char *)0x0) {
          return false;
        }
        __n_00 = hostname + ((long)__n_00 - (long)pcVar3);
        __n = match + ((long)__n - (long)pcVar2);
        match = pcVar2;
        hostname = pcVar3;
      }
    }
    _Var1 = pmatch(hostname,(size_t)__n_00,match,(size_t)__n);
    return _Var1;
  }
  return false;
}

Assistant:

bool Curl_cert_hostcheck(const char *match, size_t matchlen,
                         const char *hostname, size_t hostlen)
{
  if(match && *match && hostname && *hostname)
    return hostmatch(hostname, hostlen, match, matchlen);
  return FALSE;
}